

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall
Assimp::SMDImporter::ParseTrianglesSection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  byte *local_30;
  
  do {
    uVar2 = this->iLineNumber;
    this->iLineNumber = uVar2 + 1;
    while( true ) {
      bVar1 = *szCurrent;
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
      szCurrent = (char *)((byte *)szCurrent + 1);
    }
    if (bVar1 == 0) goto LAB_0060d3b3;
    iVar3 = bVar1 - 0x65;
    if ((iVar3 == 0) && (iVar3 = ((byte *)szCurrent)[1] - 0x6e, iVar3 == 0)) {
      iVar3 = 100 - (uint)((byte *)szCurrent)[2];
    }
    else {
      iVar3 = -iVar3;
    }
    if (iVar3 == 0) {
      bVar1 = ((byte *)szCurrent)[3];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        szCurrent = (char *)((byte *)szCurrent + (4 - (ulong)(bVar1 == 0)));
LAB_0060d3b3:
        this->iLineNumber = uVar2 + 2;
        while (((ulong)(byte)*szCurrent < 0x21 &&
               ((0x100002600U >> ((ulong)(byte)*szCurrent & 0x3f) & 1) != 0))) {
          szCurrent = (char *)((byte *)szCurrent + 1);
        }
        *szCurrentOut = szCurrent;
        return;
      }
    }
    local_30 = (byte *)szCurrent;
    ParseTriangle(this,szCurrent,(char **)&local_30);
    szCurrent = (char *)local_30;
  } while( true );
}

Assistant:

void SMDImporter::ParseTrianglesSection(const char* szCurrent, const char** szCurrentOut) {
    // Parse a triangle, parse another triangle, parse the next triangle ...
    // and so on until we reach a token that looks quite similar to "end"
    for ( ;; ) {
        if(!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "end\n" - Ends the triangles section
        if (TokenMatch(szCurrent,"end",3)) {
            break;
        }
        ParseTriangle(szCurrent,&szCurrent);
    }
    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    *szCurrentOut = szCurrent;
}